

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O3

FT_Error cf2_getSeacComponent(PS_Decoder *decoder,FT_Fast code,CF2_Buffer buf)

{
  CFF_Font_conflict pCVar1;
  FT_UShort FVar2;
  FT_Error FVar3;
  ulong uVar4;
  TT_Face pTVar5;
  FT_Byte *local_38;
  FT_Byte *charstring;
  FT_ULong len;
  
  uVar4 = (ulong)(uint)code;
  buf->end = (FT_Byte *)0x0;
  buf->ptr = (FT_Byte *)0x0;
  buf->error = (FT_Error *)0x0;
  buf->start = (FT_Byte *)0x0;
  pTVar5 = (TT_Face)(decoder->builder).face;
  if (((pTVar5->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
    FVar3 = 0x12;
    if (((uint)code < 0x100) && (pCVar1 = decoder->cff, (pCVar1->charset).sids != (FT_UShort *)0x0))
    {
      FVar2 = (**pCVar1->cffload)(code);
      if ((ulong)pCVar1->num_glyphs != 0) {
        uVar4 = 0;
        do {
          if ((pCVar1->charset).sids[uVar4] == FVar2) {
            if ((int)uVar4 < 0) {
              return 0x12;
            }
            pTVar5 = (TT_Face)(decoder->builder).face;
            goto LAB_0020fb5e;
          }
          uVar4 = uVar4 + 1;
        } while (pCVar1->num_glyphs != uVar4);
      }
    }
  }
  else {
LAB_0020fb5e:
    FVar3 = (*decoder->get_glyph_callback)(pTVar5,(FT_UInt)uVar4,&local_38,(FT_ULong *)&charstring);
    if (FVar3 == 0) {
      buf->start = local_38;
      buf->end = charstring + (long)local_38;
      buf->ptr = local_38;
      FVar3 = 0;
    }
  }
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_getSeacComponent( PS_Decoder*  decoder,
                        CF2_Int      code,
                        CF2_Buffer   buf )
  {
    CF2_Int   gid;
    FT_Byte*  charstring;
    FT_ULong  len;
    FT_Error  error;


    FT_ASSERT( decoder );
    FT_ASSERT( !decoder->builder.is_t1 );

    FT_ZERO( buf );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    /* Incremental fonts don't necessarily have valid charsets.        */
    /* They use the character code, not the glyph index, in this case. */
    if ( decoder->builder.face->internal->incremental_interface )
      gid = code;
    else
#endif /* FT_CONFIG_OPTION_INCREMENTAL */
    {
      gid = cff_lookup_glyph_by_stdcharcode( decoder->cff, code );
      if ( gid < 0 )
        return FT_THROW( Invalid_Glyph_Format );
    }

    error = decoder->get_glyph_callback( (TT_Face)decoder->builder.face,
                                         (CF2_UInt)gid,
                                         &charstring,
                                         &len );
    /* TODO: for now, just pass the FreeType error through */
    if ( error )
      return error;

    /* assume input has been validated */
    FT_ASSERT( charstring + len >= charstring );

    buf->start = charstring;
    buf->end   = charstring + len;
    buf->ptr   = buf->start;

    return FT_Err_Ok;
  }